

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcRampFlightType::~IfcRampFlightType(IfcRampFlightType *this)

{
  IfcTypeProduct *this_00;
  void *pvVar1;
  
  this_00 = (IfcTypeProduct *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18));
  pvVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>).field_0x20 +
           *(long *)(*(long *)this + -0x18);
  *(undefined8 *)((long)pvVar1 + -0x1b0) = 0x8562f8;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0x856410;
  *(undefined8 *)((long)pvVar1 + -0x128) = 0x856320;
  *(undefined8 *)((long)pvVar1 + -0x118) = 0x856348;
  *(undefined8 *)((long)pvVar1 + -0xc0) = 0x856370;
  *(undefined8 *)((long)pvVar1 + -0x68) = 0x856398;
  *(undefined8 *)((long)pvVar1 + -0x30) = 0x8563c0;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x8563e8;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  *(undefined8 *)&this_00->super_IfcTypeObject = 0x8566d8;
  *(undefined8 *)&this_00[1].super_IfcTypeObject.field_0x60 = 0x8567a0;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0x88 = 0x856700;
  (this_00->super_IfcTypeObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x856728;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0xf0 = 0x856750;
  *(undefined8 *)&this_00->field_0x148 = 0x856778;
  if (*(undefined1 **)&this_00->field_0x158 != &this_00[1].super_IfcTypeObject.field_0x8) {
    operator_delete(*(undefined1 **)&this_00->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__00856438);
  operator_delete(this_00);
  return;
}

Assistant:

IfcRampFlightType() : Object("IfcRampFlightType") {}